

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DRAMAddr.cpp
# Opt level: O2

void DRAMAddr::initialize(uint64_t num_bank_rank_functions,char *start_address)

{
  mem_config_t cfg;
  string local_38;
  allocator<char> local_11;
  
  cfg = 0x1010210;
  if (num_bank_rank_functions != 5) {
    if (num_bank_rank_functions != 4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,
                 "Could not initialize DRAMAddr as #ranks seems not to be 1 or 2.",&local_11);
      Logger::log_error(&local_38,true);
      std::__cxx11::string::~string((string *)&local_38);
      exit(1);
    }
    cfg = 0x1010110;
  }
  load_mem_config(cfg);
  base_msb = (ulong)start_address & 0xffffffffc0000000;
  return;
}

Assistant:

void DRAMAddr::initialize(uint64_t num_bank_rank_functions, volatile char *start_address) {
  // TODO: This is a shortcut to check if it's a single rank dimm or dual rank in order to load the right memory
  //  configuration. We should get these infos from dmidecode to do it properly, but for now this is easier.
  size_t num_ranks;
  if (num_bank_rank_functions==5) {
    num_ranks = RANKS(2);
  } else if (num_bank_rank_functions==4) {
    num_ranks = RANKS(1);
  } else {
    Logger::log_error("Could not initialize DRAMAddr as #ranks seems not to be 1 or 2.");
    exit(1);
  }
  DRAMAddr::load_mem_config((CHANS(CHANNEL) | DIMMS(DIMM) | num_ranks | BANKS(NUM_BANKS)));
  DRAMAddr::set_base_msb((void *) start_address);
}